

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void charaff_from_obj_index(OBJ_INDEX_DATA *obj,AFFECT_DATA *paf)

{
  AFFECT_DATA *pAVar1;
  char *pcVar2;
  AFFECT_DATA *pAVar3;
  string_view fmt;
  size_t sStack_8;
  
  pAVar1 = obj->charaffs;
  if (pAVar1 == (AFFECT_DATA *)0x0) {
    pcVar2 = "charaff_from_obj_index: no affect.";
    sStack_8 = 0x22;
LAB_002fe007:
    fmt._M_str = pcVar2;
    fmt._M_len = sStack_8;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (pAVar1 == paf) {
    pAVar3 = (AFFECT_DATA *)&obj->charaffs;
  }
  else {
    do {
      pAVar3 = pAVar1;
      if (pAVar3 == (AFFECT_DATA *)0x0) {
        pcVar2 = "charaff_from_obj_index: cannot find paf.";
        sStack_8 = 0x28;
        goto LAB_002fe007;
      }
      pAVar1 = pAVar3->next;
    } while (pAVar3->next != paf);
  }
  pAVar3->next = paf->next;
  free_affect(paf);
  return;
}

Assistant:

void charaff_from_obj_index(OBJ_INDEX_DATA *obj, AFFECT_DATA *paf)
{
	if (obj->charaffs == nullptr)
	{
		RS.Logger.Warn("charaff_from_obj_index: no affect.");
		return;
	}

	if (paf == obj->charaffs)
	{
		obj->charaffs = paf->next;
	}
	else
	{
		AFFECT_DATA *prev;
		for (prev = obj->charaffs; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("charaff_from_obj_index: cannot find paf.");
			return;
		}
	}

	free_affect(paf);
}